

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::fixBlockLocations
          (HlslParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TTypeList *typeList,
          bool memberWithLocation,bool memberWithoutLocation)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  undefined4 extraout_var;
  TSourceLoc *memberLoc;
  TQualifier *memberQualifier;
  uint local_30;
  uint member;
  int nextLocation;
  bool memberWithoutLocation_local;
  bool memberWithLocation_local;
  TTypeList *typeList_local;
  TQualifier *qualifier_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  TQualifier *this_00;
  
  bVar2 = TQualifier::hasLocation(qualifier);
  if (((bVar2) || (!memberWithLocation)) || (!memberWithoutLocation)) {
    if (memberWithLocation) {
      local_30 = 0;
      bVar2 = TQualifier::hasAnyLocation(qualifier);
      if (bVar2) {
        local_30 = (uint)*(undefined8 *)&qualifier->field_0x1c & 0xfff;
        *(ulong *)&qualifier->field_0x1c =
             *(ulong *)&qualifier->field_0x1c & 0xfffffffffffff000 | 0xfff;
        bVar2 = TQualifier::hasComponent(qualifier);
        if (bVar2) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot apply to a block","component","");
        }
        bVar2 = TQualifier::hasIndex(qualifier);
        if (bVar2) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot apply to a block","index","");
        }
      }
      for (memberQualifier._4_4_ = 0;
          sVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                            (&typeList->
                              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ), memberQualifier._4_4_ < sVar4;
          memberQualifier._4_4_ = memberQualifier._4_4_ + 1) {
        pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](&typeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ,(ulong)memberQualifier._4_4_);
        iVar3 = (*pvVar5->type->_vptr_TType[10])();
        this_00 = (TQualifier *)CONCAT44(extraout_var,iVar3);
        pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](&typeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ,(ulong)memberQualifier._4_4_);
        bVar2 = TQualifier::hasLocation(this_00);
        if (!bVar2) {
          if (0xffe < (int)local_30) {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,&pvVar5->loc,"location is too large","location","");
          }
          *(ulong *)&this_00->field_0x1c =
               *(ulong *)&this_00->field_0x1c & 0xfffffffffffff000 | (ulong)local_30 & 0xfff;
          *(ulong *)&this_00->field_0x1c = *(ulong *)&this_00->field_0x1c & 0xffffffffffff8fff;
        }
        uVar1 = *(undefined8 *)&this_00->field_0x1c;
        pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](&typeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ,(ulong)memberQualifier._4_4_);
        iVar3 = TIntermediate::computeTypeLocationSize
                          (pvVar5->type,
                           (this->super_TParseContextBase).super_TParseVersions.language);
        local_30 = ((uint)uVar1 & 0xfff) + iVar3;
      }
    }
  }
  else {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "either the block needs a location, or all members need a location, or no members have a location"
               ,"location","");
  }
  return;
}

Assistant:

void HlslParseContext::fixBlockLocations(const TSourceLoc& loc, TQualifier& qualifier, TTypeList& typeList, bool memberWithLocation, bool memberWithoutLocation)
{
    // "If a block has no block-level location layout qualifier, it is required that either all or none of its members
    // have a location layout qualifier, or a compile-time error results."
    if (! qualifier.hasLocation() && memberWithLocation && memberWithoutLocation)
        error(loc, "either the block needs a location, or all members need a location, or no members have a location", "location", "");
    else {
        if (memberWithLocation) {
            // remove any block-level location and make it per *every* member
            int nextLocation = 0;  // by the rule above, initial value is not relevant
            if (qualifier.hasAnyLocation()) {
                nextLocation = qualifier.layoutLocation;
                qualifier.layoutLocation = TQualifier::layoutLocationEnd;
                if (qualifier.hasComponent()) {
                    // "It is a compile-time error to apply the *component* qualifier to a ... block"
                    error(loc, "cannot apply to a block", "component", "");
                }
                if (qualifier.hasIndex()) {
                    error(loc, "cannot apply to a block", "index", "");
                }
            }
            for (unsigned int member = 0; member < typeList.size(); ++member) {
                TQualifier& memberQualifier = typeList[member].type->getQualifier();
                const TSourceLoc& memberLoc = typeList[member].loc;
                if (! memberQualifier.hasLocation()) {
                    if (nextLocation >= (int)TQualifier::layoutLocationEnd)
                        error(memberLoc, "location is too large", "location", "");
                    memberQualifier.layoutLocation = nextLocation;
                    memberQualifier.layoutComponent = 0;
                }
                nextLocation = memberQualifier.layoutLocation +
                               intermediate.computeTypeLocationSize(*typeList[member].type, language);
            }
        }
    }
}